

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddPegoutTxOut
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset,
          BlockHash *genesisblock_hash,Address *btc_address,NetType bitcoin_net_type,
          Pubkey *online_pubkey,Privkey *master_online_key,string *btc_descriptor,
          uint32_t bip32_counter,ByteData *whitelist,NetType elements_net_type,
          Address *btc_derive_address)

{
  char cVar1;
  uint32_t uVar2;
  Script local_260;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_228;
  PegoutKeyData key_data;
  Script script;
  Script locking_script;
  
  cfd::core::Script::Script(&script);
  core::PegoutKeyData::PegoutKeyData(&key_data);
  cVar1 = cfd::core::Pubkey::IsValid();
  if (cVar1 != '\0') {
    cVar1 = cfd::core::Privkey::IsValid();
    if (cVar1 != '\0') {
      cfd::core::Address::Address((Address *)&locking_script);
      cfd::core::ByteData::ByteData((ByteData *)&local_228);
      cfd::core::ConfidentialTransaction::GetPegoutPubkeyData
                ((Pubkey *)&local_260,(Privkey *)online_pubkey,(string *)master_online_key,
                 (uint)btc_descriptor,(ByteData *)(ulong)bip32_counter,(NetType)whitelist,
                 (ByteData *)(ulong)bitcoin_net_type,(NetType)&local_228,
                 (Address *)(ulong)elements_net_type);
      core::PegoutKeyData::operator=(&key_data,(PegoutKeyData *)&local_260);
      core::PegoutKeyData::~PegoutKeyData((PegoutKeyData *)&local_260);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_228);
      cfd::core::Address::GetAddress_abi_cxx11_();
      std::__cxx11::string::~string((string *)&local_260);
      if (local_260.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        cfd::core::Address::GetLockingScript();
        cfd::core::Script::operator=(&script,&local_260);
        core::Script::~Script(&local_260);
        if (btc_derive_address != (Address *)0x0) {
          cfd::core::Address::operator=(btc_derive_address,(Address *)&locking_script);
        }
      }
      core::Address::~Address((Address *)&locking_script);
      goto LAB_0022e208;
    }
  }
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::operator=(&script,&locking_script);
  core::Script::~Script(&locking_script);
LAB_0022e208:
  cfd::core::ScriptUtil::CreatePegoutLogkingScript
            ((BlockHash *)&locking_script,(Script *)genesisblock_hash,(Pubkey *)&script,
             (ByteData *)&key_data);
  uVar2 = cfd::core::ConfidentialTransaction::AddTxOut
                    ((Amount *)this,(ConfidentialAssetId *)value,(Script *)asset);
  core::Script::~Script(&locking_script);
  core::PegoutKeyData::~PegoutKeyData(&key_data);
  core::Script::~Script(&script);
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddPegoutTxOut(
    const Amount& value, const ConfidentialAssetId& asset,
    const BlockHash& genesisblock_hash, const Address& btc_address,
    NetType bitcoin_net_type, const Pubkey& online_pubkey,
    const Privkey& master_online_key, const std::string& btc_descriptor,
    uint32_t bip32_counter, const ByteData& whitelist,
    NetType elements_net_type, Address* btc_derive_address) {
  Script script;
  PegoutKeyData key_data;
  if (online_pubkey.IsValid() && master_online_key.IsValid()) {
    // generate pubkey and whitelistproof
    Address derive_addr;
    key_data = ConfidentialTransaction::GetPegoutPubkeyData(
        online_pubkey, master_online_key, btc_descriptor, bip32_counter,
        whitelist, bitcoin_net_type, ByteData(), elements_net_type,
        &derive_addr);
    if (!derive_addr.GetAddress().empty()) {
      script = derive_addr.GetLockingScript();
      if (btc_derive_address != nullptr) {
        *btc_derive_address = derive_addr;
      }
    }
  } else {
    script = btc_address.GetLockingScript();
  }

  Script locking_script = ScriptUtil::CreatePegoutLogkingScript(
      genesisblock_hash, script, key_data.btc_pubkey_bytes,
      key_data.whitelist_proof);
  return AddTxOut(value, asset, locking_script);
}